

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bblif.c
# Opt level: O2

void Bbl_ManAddFanin(Bbl_Man_t *p,int ObjId,int FaninId)

{
  int iVar1;
  int iVar2;
  int *piVar3;
  int iVar4;
  ulong uVar5;
  char *pcVar6;
  long lVar7;
  
  uVar5 = (ulong)(uint)ObjId;
  piVar3 = p->vId2Obj->pArray;
  iVar1 = piVar3[ObjId];
  lVar7 = (long)iVar1;
  pcVar6 = p->pObjs->pArray;
  if ((pcVar6[lVar7 + 8] & 1U) == 0) {
    iVar2 = piVar3[FaninId];
    if ((pcVar6[(long)iVar2 + 8] & 2U) == 0) {
      iVar4 = Vec_IntEntry(p->vFaninNums,ObjId);
      if (iVar4 < (int)(*(uint *)(pcVar6 + lVar7 + 8) >> 4)) {
        Vec_IntWriteEntry(p->vFaninNums,ObjId,iVar4 + 1);
        *(int *)(pcVar6 + (long)iVar4 * 4 + lVar7 + 0xc) = iVar1 - iVar2;
        return;
      }
      printf("Bbl_ManAddFanin(): Trying to add more fanins to object (Id = %d) than declared (%d).\n"
             ,uVar5);
      return;
    }
    pcVar6 = "Bbl_ManAddFanin(): Cannot add fanout of the combinational output (Id = %d).\n";
    uVar5 = (ulong)(uint)FaninId;
  }
  else {
    pcVar6 = "Bbl_ManAddFanin(): Cannot add fanin of the combinational input (Id = %d).\n";
  }
  printf(pcVar6,uVar5);
  return;
}

Assistant:

void Bbl_ManAddFanin( Bbl_Man_t * p, int ObjId, int FaninId )
{
    Bbl_Obj_t * pObj, * pFanin;
    int iFanin;
    pObj   = Bbl_ManObj( p, ObjId );
    if ( Bbl_ObjIsCi(pObj) )
    {
        printf( "Bbl_ManAddFanin(): Cannot add fanin of the combinational input (Id = %d).\n", ObjId );
        return;
    }
    pFanin = Bbl_ManObj( p, FaninId );
    if ( Bbl_ObjIsCo(pFanin) )
    {
        printf( "Bbl_ManAddFanin(): Cannot add fanout of the combinational output (Id = %d).\n", FaninId );
        return;
    }
    iFanin = Vec_IntEntry( p->vFaninNums, ObjId );
    if ( iFanin >= (int)pObj->nFanins )
    {
        printf( "Bbl_ManAddFanin(): Trying to add more fanins to object (Id = %d) than declared (%d).\n", ObjId, pObj->nFanins );
        return;
    }
    assert( iFanin < (int)pObj->nFanins );
    Vec_IntWriteEntry( p->vFaninNums, ObjId, iFanin+1 );
    pObj->pFanins[iFanin] = (char *)pObj - (char *)pFanin;
}